

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_gc.c
# Opt level: O2

void lj_gc_closeuv(global_State *g,GCupval *uv)

{
  byte bVar1;
  ulong uVar2;
  GCobj *v;
  
  (uv->field_5).tv = *(TValue *)(uv->v).ptr64;
  (uv->v).ptr64 = (uint64_t)&uv->field_5;
  uv->closed = '\x01';
  (uv->nextgc).gcptr64 = (g->gc).root.gcptr64;
  (g->gc).root.gcptr64 = (uint64_t)uv;
  bVar1 = uv->marked;
  if ((bVar1 & 7) == 0) {
    if (1 < (byte)((g->gc).state - 1)) {
      uv->marked = (g->gc).currentwhite & 3 | bVar1;
      return;
    }
    uv->marked = bVar1 | 4;
    uVar2 = (uv->field_5).field_1.prev.gcptr64;
    if (((int)((long)uVar2 >> 0x2f) + 0xdU < 9) &&
       (v = (GCobj *)(uVar2 & 0x7fffffffffff), ((v->gch).marked & 3) != 0)) {
      lj_gc_barrierf(g,(GCobj *)uv,v);
      return;
    }
  }
  return;
}

Assistant:

void lj_gc_closeuv(global_State *g, GCupval *uv)
{
  GCobj *o = obj2gco(uv);
  /* Copy stack slot to upvalue itself and point to the copy. */
  copyTV(mainthread(g), &uv->tv, uvval(uv));
  setmref(uv->v, &uv->tv);
  uv->closed = 1;
  setgcrefr(o->gch.nextgc, g->gc.root);
  setgcref(g->gc.root, o);
  if (isgray(o)) {  /* A closed upvalue is never gray, so fix this. */
    if (g->gc.state == GCSpropagate || g->gc.state == GCSatomic) {
      gray2black(o);  /* Make it black and preserve invariant. */
      if (tviswhite(&uv->tv))
	lj_gc_barrierf(g, o, gcV(&uv->tv));
    } else {
      makewhite(g, o);  /* Make it white, i.e. sweep the upvalue. */
      lj_assertG(g->gc.state != GCSfinalize && g->gc.state != GCSpause,
		 "bad GC state");
    }
  }
}